

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

void __thiscall FunctionValueAnalyser::visit(FunctionValueAnalyser *this,Function *func)

{
  this->valid_ = true;
  (this->returnType_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> =
       (_Optional_payload_base<TypeName>)
       ((ulong)*(uint *)&(func->super_Value).field_0xc | 0x100000000);
  std::
  optional<std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>>
  ::operator=((optional<std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>>
               *)&this->arguments_,&func->arguments_);
  (this->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (func->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(func->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::optional<Context>::operator=(&this->context_,&func->context_);
  return;
}

Assistant:

void FunctionValueAnalyser::visit(const Function& func)
{
  valid_ = true;
  returnType_ = func.getReturnType();
  arguments_ = func.getArguments();
  body_ = func.getBodyPtr();
  context_ = func.getContext();
}